

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O0

bool slang::ast::Pattern::createPatternVars
               (ASTContext *context,PatternSyntax *syntax,Type *targetType,
               SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *results)

{
  VariablePatternSyntax *node;
  SourceLocation args_1;
  Symbol *this;
  Type *in_RCX;
  PatternSyntax *in_RDX;
  ASTContext *in_RSI;
  string_view sVar1;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *in_stack_00000020;
  Type *in_stack_00000028;
  TaggedPatternSyntax *in_stack_00000030;
  ASTContext *in_stack_00000038;
  PatternVarSymbol *var;
  VariablePatternSyntax *varSyntax;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *in_stack_00000120;
  Type *in_stack_00000128;
  StructurePatternSyntax *in_stack_00000130;
  ASTContext *in_stack_00000138;
  PatternVarSymbol **in_stack_ffffffffffffff88;
  SmallVectorBase<const_slang::ast::PatternVarSymbol_*> *in_stack_ffffffffffffff90;
  Token *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  SyntaxKind SVar2;
  SmallVector<const_slang::ast::PatternVarSymbol_*,_5UL> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  SVar2 = *(SyntaxKind *)&(in_RSI->scope).ptr;
  if (SVar2 == ParenthesizedPattern) {
    slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedPatternSyntax>((SyntaxNode *)in_RSI);
    not_null<slang::syntax::PatternSyntax_*>::operator*
              ((not_null<slang::syntax::PatternSyntax_*> *)0x6ac0ce);
    local_1 = createPatternVars(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd0);
  }
  else if (SVar2 == StructurePattern) {
    slang::syntax::SyntaxNode::as<slang::syntax::StructurePatternSyntax>((SyntaxNode *)in_RSI);
    local_1 = StructurePattern::createVars
                        (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120);
  }
  else if (SVar2 == TaggedPattern) {
    slang::syntax::SyntaxNode::as<slang::syntax::TaggedPatternSyntax>((SyntaxNode *)in_RSI);
    local_1 = TaggedPattern::createVars
                        (in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    if (SVar2 == VariablePattern) {
      node = slang::syntax::SyntaxNode::as<slang::syntax::VariablePatternSyntax>
                       ((SyntaxNode *)in_RSI);
      ASTContext::getCompilation((ASTContext *)0x6ac109);
      sVar1 = parsing::Token::valueText(in_stack_ffffffffffffffa0);
      args_1 = parsing::Token::location(&node->variableName);
      this = (Symbol *)
             BumpAllocator::
             emplace<slang::ast::PatternVarSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::Type_const&>
                       ((BumpAllocator *)sVar1._M_str,
                        (basic_string_view<char,_std::char_traits<char>_> *)sVar1._M_len,
                        (SourceLocation *)args_1,(Type *)CONCAT44(SVar2,in_stack_ffffffffffffffa8));
      Symbol::setSyntax(this,(SyntaxNode *)node);
      SmallVectorBase<const_slang::ast::PatternVarSymbol_*>::push_back
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Pattern::createPatternVars(const ASTContext& context, const PatternSyntax& syntax,
                                const Type& targetType,
                                SmallVector<const PatternVarSymbol*>& results) {
    switch (syntax.kind) {
        case SyntaxKind::ParenthesizedPattern:
            return createPatternVars(context, *syntax.as<ParenthesizedPatternSyntax>().pattern,
                                     targetType, results);
        case SyntaxKind::VariablePattern: {
            auto& varSyntax = syntax.as<VariablePatternSyntax>();
            auto var = context.getCompilation().emplace<PatternVarSymbol>(
                varSyntax.variableName.valueText(), varSyntax.variableName.location(), targetType);
            var->setSyntax(varSyntax);
            results.push_back(var);
            break;
        }
        case SyntaxKind::TaggedPattern:
            return TaggedPattern::createVars(context, syntax.as<TaggedPatternSyntax>(), targetType,
                                             results);
        case SyntaxKind::StructurePattern:
            return StructurePattern::createVars(context, syntax.as<StructurePatternSyntax>(),
                                                targetType, results);
        default:
            break;
    }

    return true;
}